

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsmp.h
# Opt level: O3

ssize_t __thiscall bsplib::Bsmp::send(Bsmp *this,int __fd,void *__buf,size_t __n,int __flags)

{
  A2A *a2a;
  size_t __n_00;
  ssize_t sVar1;
  undefined4 in_register_00000084;
  
  __n_00 = CONCAT44(in_register_00000084,__flags);
  this->m_send_empty = false;
  a2a = &this->m_a2a;
  serial<unsigned_long>(a2a,__fd,CONCAT44(in_register_00000084,__flags) + 1);
  A2A::send(a2a,__fd,__buf,this->m_send_tag_size,__flags);
  sVar1 = A2A::send(a2a,__fd,(void *)__n,__n_00,__flags);
  return sVar1;
}

Assistant:

void send( int pid, const void * tag, const void * payload, size_t nbytes )
    {
#ifdef PROFILE
        TicToc t(TicToc::BSMP);
        size_t start = m_a2a.send_size(pid);
#endif
        m_send_empty = false;
        serial( m_a2a, pid, nbytes + 1 );
        m_a2a.send( pid, tag, m_send_tag_size );
        m_a2a.send( pid, payload, nbytes );
#ifdef PROFILE
        size_t end = m_a2a.send_size(pid);
        t.add_bytes(end-start);
#endif
    }